

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botl.c
# Opt level: O0

char * rank_of(int lev,short monnum,boolean female)

{
  int local_24;
  Role *pRStack_20;
  int i;
  Role *role;
  boolean female_local;
  short monnum_local;
  char *pcStack_10;
  int lev_local;
  
  for (pRStack_20 = roles;
      (((pRStack_20->name).m != (char *)0x0 && (monnum != pRStack_20->malenum)) &&
      (monnum != pRStack_20->femalenum)); pRStack_20 = pRStack_20 + 1) {
  }
  if ((pRStack_20->name).m == (char *)0x0) {
    pRStack_20 = &urole;
  }
  local_24 = xlev_to_rank(lev);
  while( true ) {
    if (local_24 < 0) {
      if ((female == '\0') || ((pRStack_20->name).f == (char *)0x0)) {
        if ((pRStack_20->name).m == (char *)0x0) {
          pcStack_10 = "Player";
        }
        else {
          pcStack_10 = (pRStack_20->name).m;
        }
      }
      else {
        pcStack_10 = (pRStack_20->name).f;
      }
      return pcStack_10;
    }
    if ((female != '\0') && (pRStack_20->rank[local_24].f != (char *)0x0)) break;
    if (pRStack_20->rank[local_24].m != (char *)0x0) {
      return pRStack_20->rank[local_24].m;
    }
    local_24 = local_24 + -1;
  }
  return pRStack_20->rank[local_24].f;
}

Assistant:

const char *rank_of(int lev, short monnum, boolean female)
{
	struct Role *role;
	int i;


	/* Find the role */
	for (role = (struct Role *) roles; role->name.m; role++)
	    if (monnum == role->malenum || monnum == role->femalenum)
	    	break;
	if (!role->name.m)
	    role = &urole;

	/* Find the rank */
	for (i = xlev_to_rank((int)lev); i >= 0; i--) {
	    if (female && role->rank[i].f) return role->rank[i].f;
	    if (role->rank[i].m) return role->rank[i].m;
	}

	/* Try the role name, instead */
	if (female && role->name.f) return role->name.f;
	else if (role->name.m) return role->name.m;
	return "Player";
}